

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void trace2(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  
  print_node(pObj);
  local_1c = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 <= local_1c) {
      return;
    }
    pObj_00 = Abc_ObjFanin(pObj,local_1c);
    if ((int)((*(uint *)&pObj->field_0x14 >> 0xc) - 1) <=
        (int)(*(uint *)&pObj_00->field_0x14 >> 0xc)) break;
    local_1c = local_1c + 1;
  }
  trace2(pObj_00);
  return;
}

Assistant:

void trace2(Abc_Obj_t *pObj) {
  Abc_Obj_t *pNext;
  int i;

  print_node(pObj);
  Abc_ObjForEachFanin(pObj, pNext, i) 
    if (pNext->Level >= pObj->Level - 1) {
      trace2(pNext);
      break;
    }
}